

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

uint32_t asmjit::anon_unknown_32::CodeHolder_hashNameAndFixLen(char *name,size_t *nameLength)

{
  byte *pbVar1;
  uint32_t uVar2;
  size_t sVar3;
  byte bVar4;
  size_t i;
  size_t sVar5;
  
  sVar3 = *nameLength;
  if (sVar3 == 0xffffffffffffffff) {
    bVar4 = *name;
    if (bVar4 == 0) {
      sVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      sVar3 = 0;
      do {
        uVar2 = uVar2 * 0x1003f + (uint)bVar4;
        bVar4 = name[sVar3 + 1];
        sVar3 = sVar3 + 1;
      } while (bVar4 != 0);
    }
    *nameLength = sVar3;
    return uVar2;
  }
  uVar2 = 0;
  if (sVar3 != 0) {
    sVar5 = 0;
    uVar2 = 0;
    do {
      pbVar1 = (byte *)(name + sVar5);
      if (*pbVar1 == 0) {
        return 0x11;
      }
      sVar5 = sVar5 + 1;
      uVar2 = uVar2 * 0x1003f + (uint)*pbVar1;
    } while (sVar3 != sVar5);
  }
  return uVar2;
}

Assistant:

static uint32_t CodeHolder_hashNameAndFixLen(const char* name, size_t& nameLength) noexcept {
  uint32_t hVal = 0;
  if (nameLength == Globals::kInvalidIndex) {
    size_t i = 0;
    for (;;) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (!c) break;
      hVal = Utils::hashRound(hVal, c);
      i++;
    }
    nameLength = i;
  }
  else {
    for (size_t i = 0; i < nameLength; i++) {
      uint8_t c = static_cast<uint8_t>(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hVal = Utils::hashRound(hVal, c);
    }
  }
  return hVal;
}